

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFileWriter.cpp
# Opt level: O0

ssize_t __thiscall AudioFileWriter::write(AudioFileWriter *this,int __fd,void *__buf,size_t __n)

{
  AudioFileWriter *pAVar1;
  uint *puVar2;
  QDebug *this_00;
  undefined4 in_register_00000034;
  AudioFileWriter *local_40c8;
  QString local_40b8;
  QMessageLogger local_4090;
  QDebug local_4070;
  long local_4068;
  qint64 bytesWritten;
  qint64 bytesToWrite;
  char *bufferPos;
  undefined1 local_4048 [3];
  bool converted;
  uint framesToWrite;
  qint16 cnvBuffer [8192];
  AudioFileWriter *local_40;
  qint32 *p;
  qint32 *endPos;
  qint32 *startPos;
  AudioFileWriter *pAStack_20;
  uint totalFrames_local;
  qint16 *buffer_local;
  AudioFileWriter *this_local;
  
  pAStack_20 = (AudioFileWriter *)CONCAT44(in_register_00000034,__fd);
  startPos._4_4_ = (uint)__buf;
  buffer_local = (qint16 *)this;
  local_40 = (AudioFileWriter *)QIODevice::isOpen();
  if (((ulong)local_40 & 1) == 0) {
    this_local._7_1_ = 0;
  }
  else {
    local_40 = this;
    if ((this->skipSilence & 1U) != 0) {
      pAVar1 = (AudioFileWriter *)
               ((long)&pAStack_20->_vptr_AudioFileWriter + (ulong)startPos._4_4_ * 4);
      startPos._4_4_ = 0;
      for (local_40 = pAStack_20; local_40 < pAVar1;
          local_40 = (AudioFileWriter *)((long)&local_40->_vptr_AudioFileWriter + 4)) {
        if (*(int *)&local_40->_vptr_AudioFileWriter != 0) {
          this->skipSilence = false;
          startPos._4_4_ = (uint)((long)pAVar1 - (long)local_40 >> 2);
          pAStack_20 = local_40;
          break;
        }
      }
    }
    while (startPos._4_4_ != 0) {
      puVar2 = qMin<unsigned_int>(&write::MAX_FRAMES_PER_RUN,(uint *)((long)&startPos + 4));
      bufferPos._4_4_ = *puVar2;
      bufferPos._3_1_ =
           convertSamplesFromNativeEndian
                     ((qint16 *)pAStack_20,(qint16 *)local_4048,bufferPos._4_4_ << 1,
                      (uint)((this->waveMode & 1U) != 0));
      if ((bool)bufferPos._3_1_) {
        local_40c8 = (AudioFileWriter *)local_4048;
      }
      else {
        local_40c8 = pAStack_20;
        bufferPos._4_4_ = startPos._4_4_;
      }
      bytesToWrite = (qint64)local_40c8;
      for (bytesWritten = (qint64)(bufferPos._4_4_ << 2); 0 < bytesWritten;
          bytesWritten = bytesWritten - local_4068) {
        local_4068 = QIODevice::write((char *)&this->file,bytesToWrite);
        if (local_4068 == -1) {
          QMessageLogger::QMessageLogger(&local_4090,(char *)0x0,0,(char *)0x0);
          QMessageLogger::debug();
          this_00 = QDebug::operator<<(&local_4070,
                                       "AudioFileWriter: error writing into the audio file:");
          QIODevice::errorString();
          QDebug::operator<<(this_00,&local_40b8);
          QString::~QString(&local_40b8);
          QDebug::~QDebug(&local_4070);
          local_40 = (AudioFileWriter *)QFileDevice::close();
          this_local._7_1_ = 0;
          goto LAB_00131a60;
        }
        bytesToWrite = local_4068 + bytesToWrite;
      }
      pAStack_20 = (AudioFileWriter *)
                   ((long)&pAStack_20->_vptr_AudioFileWriter + (ulong)(bufferPos._4_4_ << 1) * 2);
      startPos._4_4_ = startPos._4_4_ - bufferPos._4_4_;
      local_40 = (AudioFileWriter *)(ulong)startPos._4_4_;
    }
    this_local._7_1_ = 1;
  }
LAB_00131a60:
  return CONCAT71((int7)((ulong)local_40 >> 8),this_local._7_1_);
}

Assistant:

bool AudioFileWriter::write(const qint16 *buffer, uint totalFrames) {
	static const uint MAX_FRAMES_PER_RUN = 4096;

	if (!file.isOpen()) return false;

	const qint32 *startPos = (const qint32 *)buffer;
	if (skipSilence) {
		const qint32 *endPos = startPos + totalFrames;
		totalFrames = 0;
		for (const qint32 *p = startPos; p < endPos; p++) {
			if (*p != 0) {
				skipSilence = false;
				totalFrames = endPos - p;
				buffer = (const qint16 *)p;
				break;
			}
		}
	}

	qint16 cnvBuffer[MAX_FRAMES_PER_RUN << 1];
	while (totalFrames > 0) {
		uint framesToWrite = qMin(MAX_FRAMES_PER_RUN, totalFrames);
		bool converted = convertSamplesFromNativeEndian(buffer, cnvBuffer, framesToWrite << 1, waveMode ? QSysInfo::LittleEndian : QSysInfo::BigEndian);
		if (!converted) framesToWrite = totalFrames;

		const char *bufferPos = (const char *)(converted ? cnvBuffer : buffer);
		qint64 bytesToWrite = framesToWrite * FRAME_SIZE;
		while (bytesToWrite > 0) {
			qint64 bytesWritten = file.write(bufferPos, bytesToWrite);
			if (bytesWritten == -1) {
				qDebug() << "AudioFileWriter: error writing into the audio file:" << file.errorString();
				file.close();
				return false;
			}
			bytesToWrite -= bytesWritten;
			bufferPos += bytesWritten;
		}
		buffer += framesToWrite << 1;
		totalFrames -= framesToWrite;
	}
	return true;
}